

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::setPos(CGUIScrollBar *this,s32 pos)

{
  int iVar1;
  bool bVar2;
  s32 sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CGUIScrollBar *in_RDI;
  f32 fVar8;
  float fVar9;
  f32 f_1;
  f32 f;
  s32 in_stack_ffffffffffffffbc;
  s32 in_stack_ffffffffffffffc0;
  s32 in_stack_ffffffffffffffc4;
  
  sVar3 = core::s32_clamp(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffbc);
  in_RDI->Pos = sVar3;
  fVar8 = range(in_RDI);
  bVar2 = core::isnotzero(fVar8,1e-06);
  if (bVar2) {
    if ((in_RDI->Horizontal & 1U) == 0) {
      iVar7 = core::rect<int>::getHeight((rect<int> *)&in_RDI->field_0x30);
      fVar9 = (float)iVar7;
      iVar7 = core::rect<int>::getWidth((rect<int> *)&in_RDI->field_0x30);
      fVar9 = -(float)iVar7 * 3.0 + fVar9;
      fVar8 = range(in_RDI);
      iVar7 = in_RDI->Pos;
      iVar1 = in_RDI->Min;
      iVar4 = core::rect<int>::getWidth((rect<int> *)&in_RDI->field_0x30);
      in_RDI->DrawPos = (int)((float)(iVar7 - iVar1) * (fVar9 / (float)fVar8) + (float)iVar4 * 0.5);
      iVar7 = core::rect<int>::getWidth((rect<int> *)&in_RDI->field_0x30);
      in_RDI->DrawHeight = iVar7;
    }
    else {
      iVar4 = core::rect<int>::getWidth((rect<int> *)&in_RDI->field_0x30);
      iVar5 = core::rect<int>::getHeight((rect<int> *)&in_RDI->field_0x30);
      fVar8 = range(in_RDI);
      iVar7 = in_RDI->Pos;
      iVar1 = in_RDI->Min;
      iVar6 = core::rect<int>::getHeight((rect<int> *)&in_RDI->field_0x30);
      in_RDI->DrawPos =
           (int)((float)(iVar7 - iVar1) * ((-(float)iVar5 * 3.0 + (float)iVar4) / (float)fVar8) +
                (float)iVar6 * 0.5);
      iVar7 = core::rect<int>::getHeight((rect<int> *)&in_RDI->field_0x30);
      in_RDI->DrawHeight = iVar7;
    }
  }
  return;
}

Assistant:

void CGUIScrollBar::setPos(s32 pos)
{
	Pos = core::s32_clamp(pos, Min, Max);

	if (core::isnotzero(range())) {
		if (Horizontal) {
			f32 f = (RelativeRect.getWidth() - ((f32)RelativeRect.getHeight() * 3.0f)) / range();
			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getHeight() * 0.5f));
			DrawHeight = RelativeRect.getHeight();
		} else {
			f32 f = (RelativeRect.getHeight() - ((f32)RelativeRect.getWidth() * 3.0f)) / range();

			DrawPos = (s32)(((Pos - Min) * f) + ((f32)RelativeRect.getWidth() * 0.5f));
			DrawHeight = RelativeRect.getWidth();
		}
	}
}